

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.hpp
# Opt level: O0

string_view __thiscall mg::data::MappedMrg::entry_data(MappedMrg *this,int index)

{
  ushort uVar1;
  uint uVar2;
  const_reference pvVar3;
  element_type *this_00;
  uint8_t *puVar4;
  uint size_bytes;
  size_t offset_bytes;
  value_type *entry;
  int index_local;
  MappedMrg *this_local;
  
  pvVar3 = std::
           vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
           ::at(&this->_entries,(long)index);
  uVar2 = pvVar3->offset;
  uVar1 = pvVar3->size_sectors;
  this_00 = std::__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  puVar4 = fs::MappedFile::data(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             (char *)(puVar4 + (ulong)uVar2 * 0x800),(ulong)uVar1 << 0xb);
  return _this_local;
}

Assistant:

const std::string_view entry_data(int index) const {
    const auto &entry = _entries.at(index);
    const size_t offset_bytes = (size_t)entry.offset * (size_t)Mrg::SECTOR_SIZE;
    const unsigned size_bytes = entry.size_sectors * Mrg::SECTOR_SIZE;
    return std::string_view(
        reinterpret_cast<const char *>(_backing_data->data()) + offset_bytes,
        size_bytes);
  }